

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

void __thiscall glslang::TParseVersions::doubleCheck(TParseVersions *this,TSourceLoc *loc,char *op)

{
  int numExtensions;
  undefined **extensions;
  char *local_8;
  
  if (this->language == EShLangVertex) {
    extensions = &PTR_anon_var_dwarf_108d237_00af6530;
    numExtensions = 2;
  }
  else {
    extensions = &local_8;
    local_8 = "GL_ARB_gpu_shader_fp64";
    numExtensions = 1;
  }
  profileRequires(this,loc,6,400,numExtensions,extensions,op);
  return;
}

Assistant:

void TParseVersions::doubleCheck(const TSourceLoc& loc, const char* op)
{

    //requireProfile(loc, ECoreProfile | ECompatibilityProfile, op);
    if (language == EShLangVertex) {
        const char* const f64_Extensions[] = {E_GL_ARB_gpu_shader_fp64, E_GL_ARB_vertex_attrib_64bit};
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, 2, f64_Extensions, op);
    } else
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, E_GL_ARB_gpu_shader_fp64, op);
}